

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

void __thiscall
QVarLengthArray<QFixed,_256LL>::QVarLengthArray
          (QVarLengthArray<QFixed,_256LL> *this,qsizetype asize)

{
  void *pvVar1;
  long in_RSI;
  QVarLengthArray<QFixed,_256LL> *in_RDI;
  size_t unaff_retaddr;
  QVarLengthArray<QFixed,_256LL> *unusedCapacity;
  
  unusedCapacity = in_RDI;
  QVarLengthArray(in_RDI);
  if (0x100 < in_RSI) {
    (in_RDI->super_QVLABase<QFixed>).super_QVLABaseBase.a = in_RSI;
    pvVar1 = QtPrivate::fittedMalloc
                       ((size_t)this,(qsizetype *)asize,unaff_retaddr,(size_t)unusedCapacity);
    (in_RDI->super_QVLABase<QFixed>).super_QVLABaseBase.ptr = pvVar1;
    qt_noop();
  }
  (in_RDI->super_QVLABase<QFixed>).super_QVLABaseBase.s = in_RSI;
  return;
}

Assistant:

Q_INLINE_TEMPLATE QVarLengthArray<T, Prealloc>::QVarLengthArray(qsizetype asize)
    : QVarLengthArray()
{
    Q_ASSERT_X(asize >= 0, "QVarLengthArray::QVarLengthArray(qsizetype)",
               "Size must be greater than or equal to 0.");

    // historically, this ctor worked for non-copyable/non-movable T, so keep it working, why not?
    // resize(asize) // this requires a movable or copyable T, can't use, need to do it by hand

    if (asize > Prealloc) {
        this->a = asize;
        this->ptr = QtPrivate::fittedMalloc(0, &this->a, sizeof(T));
        Q_CHECK_PTR(this->ptr);
    }
    if constexpr (QTypeInfo<T>::isComplex)
        std::uninitialized_default_construct_n(data(), asize);
    this->s = asize;
}